

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

vec3 polyscope::view::bufferCoordsToWorldRay(vec2 screenCoords)

{
  undefined1 auVar1 [16];
  undefined8 uVar7;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar8;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec3 vVar6;
  vec3 screenPos3;
  mat4 view;
  mat4 proj;
  undefined1 local_d8 [16];
  vec<3,_float,_(glm::qualifier)0> local_c0;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_b4;
  float local_b0;
  undefined4 local_ac;
  vec<4,_float,_(glm::qualifier)0> local_a8;
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  mat<4,_4,_float,_(glm::qualifier)0> local_50;
  undefined1 auVar3 [64];
  
  local_d8._8_8_ = in_XMM0_Qb;
  local_d8._0_8_ = screenCoords;
  local_98.value[0]._0_8_ = _viewMat;
  local_98.value[0]._8_8_ = _DAT_0059f6dc;
  local_98.value[1]._0_8_ = uRam000000000059f6e4;
  local_98.value[1]._8_8_ = _DAT_0059f6ec;
  local_98.value[2]._0_8_ = uRam000000000059f6f4;
  local_98.value[2]._8_8_ = _DAT_0059f6fc;
  local_98.value[3]._0_8_ = uRam000000000059f704;
  local_98.value[3]._8_8_ = uRam000000000059f70c;
  getCameraPerspectiveMatrix();
  local_a8.field_2.z = (float)bufferWidth;
  local_a8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_a8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  auVar1 = vmovshdup_avx(local_d8);
  local_b4 = screenCoords.field_0;
  local_a8.field_3.w = (float)bufferHeight;
  local_b0 = local_a8.field_3.w - auVar1._0_4_;
  auVar4 = (undefined1  [56])0x0;
  local_ac = 0;
  vVar5 = glm::unProjectNO<float,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_b4,&local_98,&local_50,&local_a8);
  auVar2._0_8_ = vVar5._0_8_;
  auVar2._8_56_ = auVar4;
  vVar6 = getCameraWorldPosition();
  auVar3._0_8_ = vVar6._0_8_;
  auVar3._8_56_ = auVar4;
  auVar1 = vsubps_avx(auVar2._0_16_,auVar3._0_16_);
  local_c0.field_2.z = vVar5.field_2.z - vVar6.field_2.z;
  local_c0._0_8_ = vmovlps_avx(auVar1);
  vVar5 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_c0);
  vVar6.field_0 = vVar5.field_0;
  uVar7._4_4_ = vVar5.field_1;
  register0x00001240 = vVar5.field_2;
  return vVar6;
}

Assistant:

glm::vec3 bufferCoordsToWorldRay(glm::vec2 screenCoords) {

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::vec4 viewport = {0., 0., view::bufferWidth, view::bufferHeight};

  glm::vec3 screenPos3{screenCoords.x, view::bufferHeight - screenCoords.y, 0.};
  glm::vec3 worldPos = glm::unProject(screenPos3, view, proj, viewport);
  glm::vec3 worldRayDir = glm::normalize(glm::vec3(worldPos) - getCameraWorldPosition());

  return worldRayDir;
}